

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

void ChangeInteger(uint32_t ofs,uint32_t n)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_14 [4];
  
  uVar2 = ftell((FILE *)out);
  iVar1 = fseek((FILE *)out,(ulong)ofs,0);
  if (iVar1 != 0) {
    __assert_fail("0 == retCode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x119,"void ChangeInteger(uint32_t, uint32_t)");
  }
  fwrite(local_14,4,1,(FILE *)out);
  iVar1 = fseek((FILE *)out,uVar2 & 0xffffffff,0);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("0 == retCode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x11c,"void ChangeInteger(uint32_t, uint32_t)");
}

Assistant:

void ChangeInteger(uint32_t ofs,uint32_t n)
{
	const uint32_t cur = ftell(out);
    int retCode;
    retCode = fseek(out, ofs, SEEK_SET);
    ai_assert(0 == retCode);
	fwrite(&n, 4, 1, out);
    retCode = fseek(out, cur, SEEK_SET);
    ai_assert(0 == retCode);
}